

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O3

void dec_vproc_put_frame(Mpp *mpp,MppFrame frame,MppBuffer buf,RK_S64 pts,RK_U32 err)

{
  pthread_mutex_t *__mutex;
  MppFrame pvVar1;
  MppFrame s;
  RK_U32 RVar2;
  undefined4 extraout_var;
  void *pvVar3;
  uint uVar4;
  MppFrame out;
  RK_S64 local_50;
  RK_U32 local_44;
  undefined8 local_40;
  MppFrame local_38;
  
  local_50 = CONCAT44(local_50._4_4_,err);
  __mutex = (pthread_mutex_t *)mpp->mFrmOut;
  out = (MppFrame)0x0;
  mpp_frame_init(&out);
  local_38 = frame;
  mpp_frame_copy(out,frame);
  pvVar1 = out;
  if (-1 < pts) {
    *(RK_S64 *)((long)out + 0x38) = pts;
  }
  if (buf != (MppBuffer)0x0) {
    *(MppBuffer *)((long)out + 0x98) = buf;
  }
  *(uint *)((long)out + 0x50) = *(uint *)((long)out + 0x50) | (uint)local_50;
  pthread_mutex_lock(__mutex);
  mpp_list::add_at_tail((mpp_list *)&__mutex->__data,&out,8);
  uVar4 = mpp->mFramePutCount + 1;
  mpp->mFramePutCount = uVar4;
  if (((byte)vproc_debug & 0x80) != 0) {
    local_44 = mpp_frame_get_poc(out);
    local_50 = mpp_frame_get_pts(out);
    s = local_38;
    RVar2 = mpp_frame_get_errinfo(local_38);
    local_40 = CONCAT44(extraout_var,RVar2);
    RVar2 = mpp_frame_get_discard(s);
    pvVar3 = mpp_buffer_get_ptr_with_caller
                       (*(MppBuffer *)((long)pvVar1 + 0x98),"dec_vproc_put_frame");
    _mpp_log_l(4,"mpp_dec_vproc","Output frame[%d]:poc %d, pts %lld, err 0x%x, dis %x, buf ptr %p\n"
               ,"dec_vproc_put_frame",(ulong)uVar4,(ulong)local_44,local_50,local_40,(ulong)RVar2,
               pvVar3);
  }
  pthread_cond_signal((pthread_cond_t *)(__mutex + 1));
  pthread_mutex_unlock(__mutex);
  if (mpp->mDec != (MppDec)0x0) {
    mpp_dec_callback(mpp->mDec,MPP_DEC_EVENT_ON_FRM_READY,out);
  }
  return;
}

Assistant:

static void dec_vproc_put_frame(Mpp *mpp, MppFrame frame, MppBuffer buf, RK_S64 pts, RK_U32 err)
{
    mpp_list *list = mpp->mFrmOut;
    MppFrame out = NULL;
    MppFrameImpl *impl = NULL;

    mpp_frame_init(&out);
    mpp_frame_copy(out, frame);
    impl = (MppFrameImpl *)out;
    if (pts >= 0)
        impl->pts = pts;
    if (buf)
        impl->buffer = buf;

    impl->errinfo |= err;

    list->lock();
    list->add_at_tail(&out, sizeof(out));

    mpp->mFramePutCount++;
    vproc_dbg_out("Output frame[%d]:poc %d, pts %lld, err 0x%x, dis %x, buf ptr %p\n",
                  mpp->mFramePutCount, mpp_frame_get_poc(out), mpp_frame_get_pts(out),
                  mpp_frame_get_errinfo(frame), mpp_frame_get_discard(frame),
                  mpp_buffer_get_ptr(impl->buffer));
    list->signal();
    list->unlock();

    if (mpp->mDec)
        mpp_dec_callback(mpp->mDec, MPP_DEC_EVENT_ON_FRM_READY, out);
}